

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::EndGroup(void)

{
  ImVec2 *lhs;
  ImVector<ImGuiGroupData> *this;
  ImGuiItemStatusFlags *pIVar1;
  float fVar2;
  float fVar3;
  char cVar4;
  ImGuiID IVar5;
  ImGuiWindow *pIVar6;
  ImVec2 IVar7;
  ImVec2 IVar8;
  ImVec2 IVar9;
  bool bVar10;
  ImGuiContext *pIVar11;
  bool bVar12;
  ImGuiGroupData *pIVar13;
  char cVar14;
  ImGuiID IVar15;
  bool bVar16;
  uint uVar17;
  ImRect group_bb;
  float local_48;
  float fStack_44;
  ImVec2 local_38;
  
  pIVar11 = GImGui;
  if ((GImGui->GroupStack).Size < 1) {
    __assert_fail("g.GroupStack.Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x216f,"void ImGui::EndGroup()");
  }
  pIVar6 = GImGui->CurrentWindow;
  this = &GImGui->GroupStack;
  pIVar13 = ImVector<ImGuiGroupData>::back(this);
  if (pIVar13->WindowID != pIVar6->ID) {
    __assert_fail("group_data.WindowID == window->ID",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x2172,"void ImGui::EndGroup()");
  }
  lhs = &(pIVar6->DC).CursorMaxPos;
  IVar8 = ImMax(lhs,&pIVar13->BackupCursorPos);
  IVar7 = pIVar13->BackupCursorPos;
  (pIVar6->DC).CursorPos = IVar7;
  group_bb.Min = IVar7;
  group_bb.Max = IVar8;
  IVar9 = ImMax(&pIVar13->BackupCursorMaxPos,lhs);
  (pIVar6->DC).CursorMaxPos = IVar9;
  (pIVar6->DC).Indent.x = (pIVar13->BackupIndent).x;
  (pIVar6->DC).GroupOffset.x = (pIVar13->BackupGroupOffset).x;
  (pIVar6->DC).CurrLineSize = pIVar13->BackupCurrLineSize;
  fVar2 = pIVar13->BackupCurrLineTextBaseOffset;
  (pIVar6->DC).CurrLineTextBaseOffset = fVar2;
  if (pIVar11->LogEnabled == true) {
    pIVar11->LogLinePosY = -3.4028235e+38;
  }
  if (pIVar13->EmitItem == false) {
    ImVector<ImGuiGroupData>::pop_back(this);
    return;
  }
  fVar3 = (pIVar6->DC).PrevLineTextBaseOffset;
  uVar17 = -(uint)(fVar2 <= fVar3);
  (pIVar6->DC).CurrLineTextBaseOffset = (float)(~uVar17 & (uint)fVar2 | (uint)fVar3 & uVar17);
  local_48 = IVar8.x;
  fStack_44 = IVar8.y;
  local_38.y = fStack_44 - IVar7.y;
  local_38.x = local_48 - IVar7.x;
  ItemSize(&local_38,-1.0);
  ItemAdd(&group_bb,0,(ImRect *)0x0,1);
  IVar5 = pIVar11->ActiveId;
  if (pIVar13->BackupActiveIdIsAlive == IVar5) {
    if (pIVar13->BackupActiveIdPreviousFrameIsAlive == false) {
      cVar4 = pIVar11->ActiveIdPreviousFrameIsAlive;
joined_r0x0013d95c:
      if (cVar4 != '\0') {
        IVar15 = pIVar11->ActiveIdPreviousFrame;
        cVar4 = '\x01';
        bVar12 = false;
        goto LAB_0013d94e;
      }
    }
    bVar10 = false;
    cVar14 = '\0';
  }
  else {
    bVar16 = pIVar11->ActiveIdIsAlive != IVar5;
    IVar15 = IVar5;
    if (pIVar13->BackupActiveIdPreviousFrameIsAlive == false) {
      cVar4 = pIVar11->ActiveIdPreviousFrameIsAlive;
      bVar12 = true;
      if (IVar5 == 0 || bVar16) goto joined_r0x0013d95c;
    }
    else {
      cVar14 = '\0';
      bVar10 = false;
      cVar4 = '\0';
      bVar12 = true;
      if (IVar5 == 0 || bVar16) goto LAB_0013d962;
    }
LAB_0013d94e:
    bVar10 = bVar12;
    cVar14 = cVar4;
    (pIVar11->LastItemData).ID = IVar15;
  }
LAB_0013d962:
  (pIVar11->LastItemData).Rect.Min = group_bb.Min;
  (pIVar11->LastItemData).Rect.Max = group_bb.Max;
  if ((pIVar13->BackupHoveredIdIsAlive == false) && (pIVar11->HoveredId != 0)) {
    pIVar1 = &(pIVar11->LastItemData).StatusFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 0x80;
  }
  if ((bVar10) && (pIVar11->ActiveIdHasBeenEditedThisFrame == true)) {
    pIVar1 = &(pIVar11->LastItemData).StatusFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 4;
  }
  uVar17 = (pIVar11->LastItemData).StatusFlags;
  (pIVar11->LastItemData).StatusFlags = uVar17 | 0x20;
  if ((cVar14 != '\0') && (IVar5 != pIVar11->ActiveIdPreviousFrame)) {
    (pIVar11->LastItemData).StatusFlags = uVar17 | 0x60;
  }
  ImVector<ImGuiGroupData>::pop_back(this);
  return;
}

Assistant:

void ImGui::EndGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(g.GroupStack.Size > 0); // Mismatched BeginGroup()/EndGroup() calls

    ImGuiGroupData& group_data = g.GroupStack.back();
    IM_ASSERT(group_data.WindowID == window->ID); // EndGroup() in wrong window?

    ImRect group_bb(group_data.BackupCursorPos, ImMax(window->DC.CursorMaxPos, group_data.BackupCursorPos));

    window->DC.CursorPos = group_data.BackupCursorPos;
    window->DC.CursorMaxPos = ImMax(group_data.BackupCursorMaxPos, window->DC.CursorMaxPos);
    window->DC.Indent = group_data.BackupIndent;
    window->DC.GroupOffset = group_data.BackupGroupOffset;
    window->DC.CurrLineSize = group_data.BackupCurrLineSize;
    window->DC.CurrLineTextBaseOffset = group_data.BackupCurrLineTextBaseOffset;
    if (g.LogEnabled)
        g.LogLinePosY = -FLT_MAX; // To enforce a carriage return

    if (!group_data.EmitItem)
    {
        g.GroupStack.pop_back();
        return;
    }

    window->DC.CurrLineTextBaseOffset = ImMax(window->DC.PrevLineTextBaseOffset, group_data.BackupCurrLineTextBaseOffset);      // FIXME: Incorrect, we should grab the base offset from the *first line* of the group but it is hard to obtain now.
    ItemSize(group_bb.GetSize());
    ItemAdd(group_bb, 0, NULL, ImGuiItemFlags_NoTabStop);

    // If the current ActiveId was declared within the boundary of our group, we copy it to LastItemId so IsItemActive(), IsItemDeactivated() etc. will be functional on the entire group.
    // It would be be neater if we replaced window.DC.LastItemId by e.g. 'bool LastItemIsActive', but would put a little more burden on individual widgets.
    // Also if you grep for LastItemId you'll notice it is only used in that context.
    // (The two tests not the same because ActiveIdIsAlive is an ID itself, in order to be able to handle ActiveId being overwritten during the frame.)
    const bool group_contains_curr_active_id = (group_data.BackupActiveIdIsAlive != g.ActiveId) && (g.ActiveIdIsAlive == g.ActiveId) && g.ActiveId;
    const bool group_contains_prev_active_id = (group_data.BackupActiveIdPreviousFrameIsAlive == false) && (g.ActiveIdPreviousFrameIsAlive == true);
    if (group_contains_curr_active_id)
        g.LastItemData.ID = g.ActiveId;
    else if (group_contains_prev_active_id)
        g.LastItemData.ID = g.ActiveIdPreviousFrame;
    g.LastItemData.Rect = group_bb;

    // Forward Hovered flag
    const bool group_contains_curr_hovered_id = (group_data.BackupHoveredIdIsAlive == false) && g.HoveredId != 0;
    if (group_contains_curr_hovered_id)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HoveredWindow;

    // Forward Edited flag
    if (group_contains_curr_active_id && g.ActiveIdHasBeenEditedThisFrame)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_Edited;

    // Forward Deactivated flag
    g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HasDeactivated;
    if (group_contains_prev_active_id && g.ActiveId != g.ActiveIdPreviousFrame)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_Deactivated;

    g.GroupStack.pop_back();
    //window->DrawList->AddRect(group_bb.Min, group_bb.Max, IM_COL32(255,0,255,255));   // [Debug]
}